

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::ObjectEnd(ParsedScene *this,FileLoc loc)

{
  pointer *pppVar1;
  char cVar2;
  pointer pGVar3;
  pointer pTVar4;
  pointer puVar5;
  pointer ppVar6;
  RGBColorSpace *pRVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  int iVar39;
  int iVar40;
  char *pcVar41;
  GraphicsState *pGVar42;
  long in_FS_OFFSET;
  char vb;
  string ret;
  
  if (this->currentApiState == OptionsBlock) {
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[10]>
              (&ret,"Scene description must be inside world block; \"%s\" not allowed. Ignoring.",
               (char (*) [10])0x28c5e21);
    Error(&loc,ret._M_dataplus._M_p);
LAB_003a8bf3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p != &ret.field_2) {
      operator_delete(ret._M_dataplus._M_p,
                      CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0])
                      + 1);
    }
    return;
  }
  if (this->currentApiState == Uninitialized) {
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[10]>
              (&ret,"pbrtInit() must be before calling \"%s()\". Ignoring.",(char (*) [10])0x28c5e21
              );
    Error(&loc,ret._M_dataplus._M_p);
    goto LAB_003a8bf3;
  }
  if (this->currentInstance == (InstanceDefinitionSceneEntity *)0x0) {
    (this->super_SceneRepresentation).errorExit = true;
    Error(&loc,"ObjectEnd called outside of instance definition");
    return;
  }
  this->currentInstance = (InstanceDefinitionSceneEntity *)0x0;
  pGVar3 = (this->pushedGraphicsStates).
           super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pGVar42 = this->graphicsState;
  std::__cxx11::string::operator=((string *)pGVar42,(string *)(pGVar3 + -1));
  std::__cxx11::string::operator=
            ((string *)&pGVar42->currentOutsideMedium,(string *)&pGVar3[-1].currentOutsideMedium);
  pGVar42->currentMaterialIndex = pGVar3[-1].currentMaterialIndex;
  std::__cxx11::string::operator=
            ((string *)&pGVar42->currentMaterialName,(string *)&pGVar3[-1].currentMaterialName);
  std::__cxx11::string::operator=
            ((string *)&pGVar42->areaLightName,(string *)&pGVar3[-1].areaLightName);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&(pGVar42->areaLightParams).params,&pGVar3[-1].areaLightParams.params);
  (pGVar42->areaLightParams).colorSpace = pGVar3[-1].areaLightParams.colorSpace;
  pGVar42->reverseOrientation = pGVar3[-1].reverseOrientation;
  pcVar41 = pGVar3[-1].areaLightLoc.filename._M_str;
  iVar39 = pGVar3[-1].areaLightLoc.line;
  iVar40 = pGVar3[-1].areaLightLoc.column;
  pRVar7 = pGVar3[-1].colorSpace;
  (pGVar42->areaLightLoc).filename._M_len = pGVar3[-1].areaLightLoc.filename._M_len;
  (pGVar42->areaLightLoc).filename._M_str = pcVar41;
  (pGVar42->areaLightLoc).line = iVar39;
  (pGVar42->areaLightLoc).column = iVar40;
  pGVar42->colorSpace = pRVar7;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&pGVar42->shapeAttributes,&pGVar3[-1].shapeAttributes);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&pGVar42->lightAttributes,&pGVar3[-1].lightAttributes);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&pGVar42->materialAttributes,&pGVar3[-1].materialAttributes);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&pGVar42->mediumAttributes,&pGVar3[-1].mediumAttributes);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::operator=(&pGVar42->textureAttributes,&pGVar3[-1].textureAttributes);
  pGVar42 = (this->pushedGraphicsStates).
            super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  (this->pushedGraphicsStates).
  super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar42;
  GraphicsState::~GraphicsState(pGVar42);
  pTVar4 = (this->pushedTransforms).
           super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (this->pushedActiveTransformBits).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar8 = *(undefined8 *)(pTVar4[-1].t[0].m.m[0] + 2);
  uVar9 = *(undefined8 *)pTVar4[-1].t[0].m.m[1];
  uVar10 = *(undefined8 *)(pTVar4[-1].t[0].m.m[1] + 2);
  uVar11 = *(undefined8 *)pTVar4[-1].t[0].m.m[2];
  uVar12 = *(undefined8 *)(pTVar4[-1].t[0].m.m[2] + 2);
  uVar13 = *(undefined8 *)pTVar4[-1].t[0].m.m[3];
  uVar14 = *(undefined8 *)(pTVar4[-1].t[0].m.m[3] + 2);
  uVar15 = *(undefined8 *)pTVar4[-1].t[0].mInv.m[0];
  uVar16 = *(undefined8 *)(pTVar4[-1].t[0].mInv.m[0] + 2);
  uVar17 = *(undefined8 *)pTVar4[-1].t[0].mInv.m[1];
  uVar18 = *(undefined8 *)(pTVar4[-1].t[0].mInv.m[1] + 2);
  uVar19 = *(undefined8 *)pTVar4[-1].t[0].mInv.m[2];
  uVar20 = *(undefined8 *)(pTVar4[-1].t[0].mInv.m[2] + 2);
  uVar21 = *(undefined8 *)pTVar4[-1].t[0].mInv.m[3];
  uVar22 = *(undefined8 *)(pTVar4[-1].t[0].mInv.m[3] + 2);
  uVar23 = *(undefined8 *)pTVar4[-1].t[1].m.m[0];
  uVar24 = *(undefined8 *)(pTVar4[-1].t[1].m.m[0] + 2);
  uVar25 = *(undefined8 *)pTVar4[-1].t[1].m.m[1];
  uVar26 = *(undefined8 *)(pTVar4[-1].t[1].m.m[1] + 2);
  uVar27 = *(undefined8 *)pTVar4[-1].t[1].m.m[2];
  uVar28 = *(undefined8 *)(pTVar4[-1].t[1].m.m[2] + 2);
  uVar29 = *(undefined8 *)pTVar4[-1].t[1].m.m[3];
  uVar30 = *(undefined8 *)(pTVar4[-1].t[1].m.m[3] + 2);
  uVar31 = *(undefined8 *)pTVar4[-1].t[1].mInv.m[0];
  uVar32 = *(undefined8 *)(pTVar4[-1].t[1].mInv.m[0] + 2);
  uVar33 = *(undefined8 *)pTVar4[-1].t[1].mInv.m[1];
  uVar34 = *(undefined8 *)(pTVar4[-1].t[1].mInv.m[1] + 2);
  uVar35 = *(undefined8 *)pTVar4[-1].t[1].mInv.m[2];
  uVar36 = *(undefined8 *)(pTVar4[-1].t[1].mInv.m[2] + 2);
  uVar37 = *(undefined8 *)pTVar4[-1].t[1].mInv.m[3];
  uVar38 = *(undefined8 *)(pTVar4[-1].t[1].mInv.m[3] + 2);
  *(undefined8 *)(this->curTransform).t[0].m.m[0] = *(undefined8 *)pTVar4[-1].t[0].m.m[0];
  *(undefined8 *)((this->curTransform).t[0].m.m[0] + 2) = uVar8;
  *(undefined8 *)(this->curTransform).t[0].m.m[1] = uVar9;
  *(undefined8 *)((this->curTransform).t[0].m.m[1] + 2) = uVar10;
  *(undefined8 *)(this->curTransform).t[0].m.m[2] = uVar11;
  *(undefined8 *)((this->curTransform).t[0].m.m[2] + 2) = uVar12;
  *(undefined8 *)(this->curTransform).t[0].m.m[3] = uVar13;
  *(undefined8 *)((this->curTransform).t[0].m.m[3] + 2) = uVar14;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[0] = uVar15;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[0] + 2) = uVar16;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[1] = uVar17;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[1] + 2) = uVar18;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[2] = uVar19;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[2] + 2) = uVar20;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[3] = uVar21;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[3] + 2) = uVar22;
  *(undefined8 *)(this->curTransform).t[1].m.m[0] = uVar23;
  *(undefined8 *)((this->curTransform).t[1].m.m[0] + 2) = uVar24;
  *(undefined8 *)(this->curTransform).t[1].m.m[1] = uVar25;
  *(undefined8 *)((this->curTransform).t[1].m.m[1] + 2) = uVar26;
  *(undefined8 *)(this->curTransform).t[1].m.m[2] = uVar27;
  *(undefined8 *)((this->curTransform).t[1].m.m[2] + 2) = uVar28;
  *(undefined8 *)(this->curTransform).t[1].m.m[3] = uVar29;
  *(undefined8 *)((this->curTransform).t[1].m.m[3] + 2) = uVar30;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[0] = uVar31;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[0] + 2) = uVar32;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[1] = uVar33;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[1] + 2) = uVar34;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[2] = uVar35;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[2] + 2) = uVar36;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[3] = uVar37;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[3] + 2) = uVar38;
  (this->pushedTransforms).
  super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar4 + -1;
  this->activeTransformBits = puVar5[-1];
  (this->pushedActiveTransformBits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar5 + -1;
  *(long *)(in_FS_OFFSET + -0x1c0) = *(long *)(in_FS_OFFSET + -0x1c0) + 1;
  ppVar6 = (this->pushStack).
           super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  cVar2 = ppVar6[-1].first;
  if (cVar2 == 'a') {
    pcVar41 = "Mismatched nesting: open AttributeBegin from %s at ObjectEnd";
  }
  else {
    if (cVar2 != 't') {
      ret._M_dataplus._M_p._0_1_ = cVar2;
      vb = 'o';
      if (cVar2 != 'o') {
        LogFatal<char_const(&)[23],char_const(&)[4],char_const(&)[23],char&,char_const(&)[4],char&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parsedscene.cpp"
                   ,0x195,"Check failed: %s == %s with %s = %s, %s = %s",
                   (char (*) [23])"pushStack.back().first",(char (*) [4])"\'o\'",
                   (char (*) [23])"pushStack.back().first",(char *)&ret,(char (*) [4])"\'o\'",&vb);
      }
      goto LAB_003a8e32;
    }
    pcVar41 = "Mismatched nesting: open TransformBegin from %s at ObjectEnd";
  }
  SceneRepresentation::ErrorExitDeferred<pbrt::FileLoc&>
            (&this->super_SceneRepresentation,&loc,pcVar41,&ppVar6[-1].second);
LAB_003a8e32:
  pppVar1 = &(this->pushStack).
             super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pppVar1 = *pppVar1 + -1;
  return;
}

Assistant:

void ParsedScene::ObjectEnd(FileLoc loc) {
    VERIFY_WORLD("ObjectEnd");
    if (currentInstance == nullptr) {
        ErrorExitDeferred(&loc, "ObjectEnd called outside of instance definition");
        return;
    }
    currentInstance = nullptr;

    // NOTE: Must keep the following consistent with AttributeEnd
    *graphicsState = std::move(pushedGraphicsStates.back());
    pushedGraphicsStates.pop_back();

    curTransform = pushedTransforms.back();
    pushedTransforms.pop_back();
    activeTransformBits = pushedActiveTransformBits.back();
    pushedActiveTransformBits.pop_back();

    ++nObjectInstancesCreated;

    if (pushStack.back().first == 't')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open TransformBegin from %s at ObjectEnd",
                          pushStack.back().second);
    else if (pushStack.back().first == 'a')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open AttributeBegin from %s at ObjectEnd",
                          pushStack.back().second);
    else
        CHECK_EQ(pushStack.back().first, 'o');
    pushStack.pop_back();
}